

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedCollator::setAttribute
          (RuleBasedCollator *this,UColAttribute attr,UColAttributeValue value,UErrorCode *errorCode
          )

{
  CollationSettings *pCVar1;
  byte bVar2;
  UColAttributeValue UVar3;
  int32_t iVar4;
  CollationSettings *this_00;
  uint uVar5;
  int32_t bit;
  undefined4 in_register_00000034;
  
  bVar2 = (byte)attr;
  UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                    (this,CONCAT44(in_register_00000034,attr),errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (UVar3 == value) {
    this->explicitlySetAttributes = this->explicitlySetAttributes | 1 << (bVar2 & 0x1f);
    return;
  }
  pCVar1 = this->tailoring->settings;
  if ((value == UCOL_DEFAULT) && (this->settings == pCVar1)) {
    this->explicitlySetAttributes =
         this->explicitlySetAttributes &
         (-2 << (bVar2 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar2 & 0x1f));
    return;
  }
  this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
  if (this_00 == (CollationSettings *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  switch(attr) {
  case UCOL_FRENCH_COLLATION:
    iVar4 = pCVar1->options;
    bit = 0x800;
    break;
  case UCOL_ALTERNATE_HANDLING:
    CollationSettings::setAlternateHandling(this_00,value,pCVar1->options,errorCode);
    goto LAB_00220cca;
  case UCOL_CASE_FIRST:
    CollationSettings::setCaseFirst(this_00,value,pCVar1->options,errorCode);
    goto LAB_00220cca;
  case UCOL_CASE_LEVEL:
    iVar4 = pCVar1->options;
    bit = 0x400;
    break;
  case UCOL_DECOMPOSITION_MODE:
    iVar4 = pCVar1->options;
    bit = 1;
    break;
  case UCOL_STRENGTH:
    CollationSettings::setStrength(this_00,value,pCVar1->options,errorCode);
    goto LAB_00220cca;
  case UCOL_HIRAGANA_QUATERNARY_MODE:
    if (((uint)(value + UCOL_SECONDARY) < 0x13) &&
       ((0x60001U >> (value + UCOL_SECONDARY & 0x1fU) & 1) != 0)) goto LAB_00220cca;
  default:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    goto LAB_00220cca;
  case UCOL_NUMERIC_COLLATION:
    iVar4 = pCVar1->options;
    bit = 2;
  }
  CollationSettings::setFlag(this_00,bit,value,iVar4,errorCode);
LAB_00220cca:
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = CollationFastLatin::getOptions(this->data,this_00,this_00->fastLatinPrimaries,0x180);
    uVar5 = 1 << (bVar2 & 0x1f);
    this_00->fastLatinOptions = iVar4;
    if (value == UCOL_DEFAULT) {
      this->explicitlySetAttributes = this->explicitlySetAttributes & ~uVar5;
    }
    else {
      this->explicitlySetAttributes = this->explicitlySetAttributes | uVar5;
    }
  }
  return;
}

Assistant:

void
RuleBasedCollator::setAttribute(UColAttribute attr, UColAttributeValue value,
                                UErrorCode &errorCode) {
    UColAttributeValue oldValue = getAttribute(attr, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(value == oldValue) {
        setAttributeExplicitly(attr);
        return;
    }
    const CollationSettings &defaultSettings = getDefaultSettings();
    if(settings == &defaultSettings) {
        if(value == UCOL_DEFAULT) {
            setAttributeDefault(attr);
            return;
        }
    }
    CollationSettings *ownedSettings = SharedObject::copyOnWrite(settings);
    if(ownedSettings == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    switch(attr) {
    case UCOL_FRENCH_COLLATION:
        ownedSettings->setFlag(CollationSettings::BACKWARD_SECONDARY, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_ALTERNATE_HANDLING:
        ownedSettings->setAlternateHandling(value, defaultSettings.options, errorCode);
        break;
    case UCOL_CASE_FIRST:
        ownedSettings->setCaseFirst(value, defaultSettings.options, errorCode);
        break;
    case UCOL_CASE_LEVEL:
        ownedSettings->setFlag(CollationSettings::CASE_LEVEL, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_NORMALIZATION_MODE:
        ownedSettings->setFlag(CollationSettings::CHECK_FCD, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_STRENGTH:
        ownedSettings->setStrength(value, defaultSettings.options, errorCode);
        break;
    case UCOL_HIRAGANA_QUATERNARY_MODE:
        // Deprecated attribute. Check for valid values but do not change anything.
        if(value != UCOL_OFF && value != UCOL_ON && value != UCOL_DEFAULT) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        }
        break;
    case UCOL_NUMERIC_COLLATION:
        ownedSettings->setFlag(CollationSettings::NUMERIC, value, defaultSettings.options, errorCode);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
    if(U_FAILURE(errorCode)) { return; }
    setFastLatinOptions(*ownedSettings);
    if(value == UCOL_DEFAULT) {
        setAttributeDefault(attr);
    } else {
        setAttributeExplicitly(attr);
    }
}